

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_export.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalExport::LogicalExport
          (LogicalExport *this,CopyFunction *function,
          unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *copy_info,
          unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
          *exported_tables)

{
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_EXPORT);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalExport_024889f8;
  (this->copy_info).super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
       (copy_info->super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)._M_t.
       super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
       super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl;
  (copy_info->super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl = (CopyInfo *)0x0;
  CopyFunction::CopyFunction(&this->function,function);
  (this->exported_tables).
  super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>.
  super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl =
       (exported_tables->
       super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
       .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl;
  (exported_tables->
  super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>)._M_t.
  super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>.
  super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl = (BoundExportData *)0x0;
  return;
}

Assistant:

LogicalExport::LogicalExport(CopyFunction function, unique_ptr<CopyInfo> copy_info,
                             unique_ptr<BoundExportData> exported_tables)
    : LogicalOperator(LogicalOperatorType::LOGICAL_EXPORT), copy_info(std::move(copy_info)),
      function(std::move(function)), exported_tables(std::move(exported_tables)) {
}